

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.h
# Opt level: O1

void __thiscall Jinx::Impl::Parser::Error<char_const*>(Parser *this,char *format,char **args)

{
  pointer pSVar1;
  
  if (this->m_error != false) {
    return;
  }
  this->m_error = true;
  if ((this->m_name)._M_string_length == 0) {
    LogWrite(Error,"Error at ");
  }
  else {
    LogWrite(Error,"Error in %s at ",(this->m_name)._M_dataplus._M_p);
  }
  pSVar1 = (this->m_currentSymbol)._M_current;
  if (pSVar1 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    LogWrite(Error,"end of script: ");
  }
  else {
    LogWrite(Error,"line %i, column %i: ",(ulong)pSVar1->lineNumber,(ulong)pSVar1->columnNumber);
  }
  LogWriteLine(Error,format,*args);
  ErrorWriteDetails(this);
  return;
}

Assistant:

void Error(const char * format, Args&&... args)
		{
			if (m_error)
				return;
			m_error = true;

			// Write error message and location
			if (m_name.empty())
				LogWrite(LogLevel::Error, "Error at ");
			else
				LogWrite(LogLevel::Error, "Error in %s at ", m_name.c_str());
			if (m_currentSymbol == m_symbolList.end())
				LogWrite(LogLevel::Error, "end of script: ");
			else
				LogWrite(LogLevel::Error, "line %i, column %i: ", m_currentSymbol->lineNumber, m_currentSymbol->columnNumber);
			LogWriteLine(LogLevel::Error, format, std::forward<Args>(args)...);

			// Write out the line of code containing the error, and a second line
			// that points out the location of the error
			ErrorWriteDetails();
		}